

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeEventPoolDestroyPrologue
          (ZEHandleLifetimeValidation *this,ze_event_pool_handle_t hEventPool)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  ze_event_pool_handle_t local_28;
  
  lVar2 = context;
  if ((hEventPool == (ze_event_pool_handle_t)0x0) ||
     (bVar3 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hEventPool), !bVar3)) {
    bVar3 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(context + 0xd48),hEventPool);
    if (!bVar3) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar3 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hEventPool);
    if (bVar3) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    local_28 = hEventPool;
    for (puVar1 = *(undefined8 **)(*(long *)(lVar2 + 0xd48) + 0xbf8); puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)*puVar1) {
      std::
      _Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<const_void_*,_const_void_*,_std::allocator<const_void_*>,_std::__detail::_Identity,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(puVar1 + 2),&local_28);
    }
    local_28 = hEventPool;
    std::
    _Hashtable<_ze_event_pool_handle_t_*,_std::pair<_ze_event_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_pool_handle_t_*>,_std::hash<_ze_event_pool_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<_ze_event_pool_handle_t_*,_std::pair<_ze_event_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_pool_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_pool_handle_t_*>,_std::hash<_ze_event_pool_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(*(long *)(lVar2 + 0xd48) + 0x1a0));
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeEventPoolDestroyPrologue(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object to destroy
        )
    { 
        
        if (hEventPool && context.handleLifetime->isHandleValid( hEventPool )){
            if (context.handleLifetime->hasDependents( hEventPool )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hEventPool);
            context.handleLifetime->removeHandle( hEventPool );
        } else if (!context.handleLifetime->isHandleValid( hEventPool )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }